

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_local_allocator.cpp
# Opt level: O0

void * __thiscall dxil_spv::ChainAllocator::Block::allocate(Block *this,size_t size)

{
  pointer puVar1;
  void *ret;
  size_t size_local;
  Block *this_local;
  
  this->offset = this->offset + 0xf & 0xfffffffffffffff0;
  if (this->block_size < this->offset + size) {
    this_local = (Block *)0x0;
  }
  else {
    puVar1 = std::unique_ptr<unsigned_char,_dxil_spv::ChainAllocator::MallocDeleter>::get
                       (&this->block);
    this_local = (Block *)(puVar1 + this->offset);
    this->offset = size + this->offset;
  }
  return this_local;
}

Assistant:

void *ChainAllocator::Block::allocate(size_t size)
{
	offset = (offset + 15) & ~size_t(15);
	if (offset + size <= block_size)
	{
		void *ret = block.get() + offset;
		offset += size;
		return ret;
	}
	else
		return nullptr;
}